

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void do_init_context(sexp_conflict *ctx,sexp_conflict *env,sexp_uint_t heap_size,
                    sexp_uint_t heap_max_size,sexp_sint_t fold_case)

{
  long lVar1;
  undefined8 in_RCX;
  undefined8 uVar2;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  long in_R8;
  
  lVar1 = sexp_make_eval_context(0,0,0,in_RDX,in_RCX);
  *in_RDI = lVar1;
  if (*in_RDI == 0) {
    fprintf(_stderr,"chibi-scheme: out of memory\n");
    exit(0x46);
  }
  uVar2 = 0x3e;
  if (in_R8 != 0) {
    uVar2 = 0x13e;
  }
  *(undefined8 *)(*(long *)(*in_RDI + 0x28) + 0x118) = uVar2;
  *in_RSI = *(undefined8 *)(*in_RDI + 0x10);
  return;
}

Assistant:

static void do_init_context (sexp* ctx, sexp* env, sexp_uint_t heap_size,
                             sexp_uint_t heap_max_size, sexp_sint_t fold_case) {
  *ctx = sexp_make_eval_context(NULL, NULL, NULL, heap_size, heap_max_size);
  if (! *ctx) {
    fprintf(stderr, "chibi-scheme: out of memory\n");
    exit_failure();
  }
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_global(*ctx, SEXP_G_FOLD_CASE_P) = sexp_make_boolean(fold_case);
#endif
  *env = sexp_context_env(*ctx);
}